

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WabtInterface.cpp
# Opt level: O3

Var Js::StringToVar(char *src,uint length,void *user_data)

{
  code *pcVar1;
  bool bVar2;
  char16 *content;
  undefined4 *puVar3;
  JavascriptString *pJVar4;
  ulong local_30;
  size_t slength;
  charcount_t bufSize;
  
  slength._4_4_ = 0;
  local_30 = (ulong)length;
  content = NarrowStringToWide((Context *)user_data,src,&local_30,
                               (charcount_t *)((long)&slength + 4));
  if (slength._4_4_ == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WabtInterface.cpp"
                                ,0x5c,"(bufSize < (4294967295U))","bufSize < UINT32_MAX");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pJVar4 = JavascriptString::NewCopyBuffer
                     (content,slength._4_4_,*(ScriptContext **)((long)user_data + 8));
  return pJVar4;
}

Assistant:

Js::Var StringToVar(const char* src, uint length, void* user_data)
{
    Context* ctx = (Context*)user_data;
    charcount_t bufSize = 0;
    size_t slength = (size_t)length;
    char16* buf = NarrowStringToWide(ctx, src, &slength, &bufSize);
    Assert(bufSize < UINT32_MAX);
    return JavascriptString::NewCopyBuffer(buf, bufSize, ctx->scriptContext);
}